

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_crc32.cc
# Opt level: O2

void __thiscall CCRC32::Init_CRC32_Table(CCRC32 *this)

{
  uint uVar1;
  int iVar2;
  CCRC32 *this_00;
  int i;
  long lVar3;
  bool bVar4;
  
  this_00 = this;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    uVar1 = Reflect(this_00,(uint)lVar3,'\b');
    uVar1 = uVar1 << 0x18;
    iVar2 = 8;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      uVar1 = (int)uVar1 >> 0x1f & 0x4c11db7U ^ uVar1 * 2;
    }
    uVar1 = Reflect(this_00,uVar1,' ');
    this->crc32_table[lVar3] = uVar1;
  }
  return;
}

Assistant:

void CCRC32::Init_CRC32_Table()
{
	// This is the official polynomial used by CRC-32 in PKZip, WinZip and Ethernet. 
	//unsigned long ulPolynomial = 0x04c11db7;
    unsigned int ulPolynomial = 0x04c11db7;

	// 256 values representing ASCII character codes.
	for(int i = 0; i <= 0xFF; i++)
	{
		crc32_table[i]=Reflect(i, 8) << 24;
        //if (i == 1)printf("old1--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
        
		for (int j = 0; j < 8; j++)
        {
            //if(i == 1)
            //{
            //    unsigned int tmp1 = (crc32_table[i] << 1);
            //    unsigned int tmp2 = (crc32_table[i] & (1 << 31) ? ulPolynomial : 0);
            //    unsigned int tmp3 = tmp1 ^ tmp2;
            //    tmp3 += 1;
            //    tmp3 -= 1;
            //
            //}
            
			crc32_table[i] = (crc32_table[i] << 1) ^ (crc32_table[i] & (1 << 31) ? ulPolynomial : 0);
            //if (i == 1)printf("old3--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
        }
        //if (i == 1)printf("old2--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
		crc32_table[i] = Reflect(crc32_table[i], 32);
	}

}